

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O0

int check_lookbehinds(uint32_t *pptr,uint32_t **retptr,parsed_recurse_check *recurses,
                     compile_block_8 *cb,int *lcptr)

{
  short sVar1;
  BOOL BVar2;
  int local_40;
  int local_3c;
  int nestlevel;
  int errorcode;
  int *lcptr_local;
  compile_block_8 *cb_local;
  parsed_recurse_check *recurses_local;
  uint32_t **retptr_local;
  uint32_t *pptr_local;
  
  local_3c = 0;
  local_40 = 0;
  cb->erroroffset = 0xffffffffffffffff;
  _nestlevel = lcptr;
  lcptr_local = (int *)cb;
  cb_local = (compile_block_8 *)recurses;
  recurses_local = (parsed_recurse_check *)retptr;
  retptr_local = (uint32_t **)pptr;
  do {
    if (*(int *)retptr_local == -0x80000000) {
      return 0;
    }
    if ((0x7fffffff < *(uint *)retptr_local) &&
       (sVar1 = *(short *)((long)retptr_local + 2), sVar1 != -0x7fff)) {
      if (sVar1 == -0x7ffe) goto LAB_001dd9d3;
      if (sVar1 != -0x7ffd) {
        if (sVar1 == -0x7ffc) {
LAB_001dd9f7:
          retptr_local = (uint32_t **)((long)retptr_local + 0xc);
        }
        else if (sVar1 == -0x7ffb) {
LAB_001dda61:
          retptr_local = (uint32_t **)((long)retptr_local + 4);
        }
        else if (sVar1 == -0x7ffa) {
          retptr_local = (uint32_t **)((long)retptr_local + 0xc);
        }
        else if (sVar1 == -0x7ff9) {
          retptr_local = (uint32_t **)((long)retptr_local + 0x14);
        }
        else if (sVar1 == -0x7ff8) {
LAB_001dd9d3:
          local_40 = local_40 + 1;
        }
        else if ((((sVar1 != -0x7ff7) && (sVar1 != -0x7ff6)) && (sVar1 != -0x7ff5)) &&
                (((sVar1 != -0x7ff4 && (sVar1 != -0x7ff3)) && (sVar1 != -0x7ff2)))) {
          if (sVar1 == -0x7ff1) goto LAB_001dd9d3;
          if (sVar1 == -0x7ff0) {
            retptr_local = retptr_local + 1;
            local_40 = local_40 + 1;
          }
          else if (((sVar1 == -0x7fef) || (sVar1 == -0x7fee)) ||
                  ((sVar1 == -0x7fed || (sVar1 == -0x7fec)))) {
            retptr_local = (uint32_t **)((long)retptr_local + 0xc);
            local_40 = local_40 + 1;
          }
          else if (sVar1 == -0x7feb) {
            retptr_local = (uint32_t **)((long)retptr_local + 0xc);
            local_40 = local_40 + 1;
          }
          else if ((sVar1 != -0x7fea) && (sVar1 != -0x7fe9)) {
            if (sVar1 == -0x7fe8) {
              if ((*(int *)retptr_local == -0x7fe7fff1) || (*(int *)retptr_local == -0x7fe7fff0)) {
                retptr_local = (uint32_t **)((long)retptr_local + 4);
              }
            }
            else if (sVar1 == -0x7fe7) {
              local_40 = local_40 + -1;
              if (local_40 < 0) {
                if (recurses_local != (parsed_recurse_check *)0x0) {
                  recurses_local->prev = (parsed_recurse_check *)retptr_local;
                }
                return 0;
              }
            }
            else {
              if (sVar1 == -0x7fe6) goto LAB_001dd9d3;
              if (sVar1 == -0x7fe5) {
LAB_001dda6f:
                retptr_local = retptr_local + 1;
              }
              else {
                if ((sVar1 == -0x7fe4) || (sVar1 == -0x7fe3)) goto LAB_001dda61;
                if ((sVar1 != -0x7fe2) && (sVar1 != -0x7fe1)) {
                  if (sVar1 == -0x7fe0) {
                    retptr_local = retptr_local + 1;
                  }
                  else {
                    if (sVar1 == -0x7fdf) goto LAB_001dd9f7;
                    if (((sVar1 == -0x7fde) || (sVar1 == -0x7fdd)) || (sVar1 == -0x7fdc))
                    goto LAB_001dd9d3;
                    if ((sVar1 != -0x7fdb) && (sVar1 != -0x7fda)) {
                      if (sVar1 == -0x7fd9) goto LAB_001dd9d3;
                      if (sVar1 != -0x7fd8) {
                        if (sVar1 == -0x7fd7) {
LAB_001dda8b:
                          retptr_local = (uint32_t **)
                                         ((long)retptr_local +
                                         (ulong)(*(int *)((long)retptr_local + 4) + 1) * 4);
                        }
                        else if (((sVar1 != -0x7fd6) && (sVar1 != -0x7fd5)) && (sVar1 != -0x7fd4)) {
                          if (sVar1 == -0x7fd3) goto LAB_001dda8b;
                          if (sVar1 != -0x7fd2) {
                            if (sVar1 == -0x7fd1) goto LAB_001dda8b;
                            if (sVar1 != -0x7fd0) {
                              if (sVar1 == -0x7fcf) goto LAB_001dda8b;
                              if (sVar1 != -0x7fce) {
                                if (sVar1 == -0x7fcd) goto LAB_001dda8b;
                                if ((((((sVar1 != -0x7fcc) && (sVar1 != -0x7fcb)) &&
                                      (sVar1 != -0x7fca)) &&
                                     ((sVar1 != -0x7fc9 && (sVar1 != -0x7fc8)))) &&
                                    ((sVar1 != -0x7fc7 && ((sVar1 != -0x7fc6 && (sVar1 != -0x7fc5)))
                                     ))) && (sVar1 != -0x7fc4)) {
                                  if (((sVar1 != -0x7fc3) && (sVar1 != -0x7fc2)) &&
                                     (sVar1 != -0x7fc1)) {
                                    return 0xaa;
                                  }
                                  goto LAB_001dda6f;
                                }
                              }
                            }
                          }
                        }
                        goto LAB_001ddad2;
                      }
                    }
                    BVar2 = set_lookbehind_lengths
                                      ((uint32_t **)&retptr_local,&local_3c,_nestlevel,
                                       (parsed_recurse_check *)cb_local,
                                       (compile_block_8 *)lcptr_local);
                    if (BVar2 == 0) {
                      return local_3c;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_001ddad2:
    retptr_local = (uint32_t **)((long)retptr_local + 4);
  } while( true );
}

Assistant:

static int
check_lookbehinds(uint32_t *pptr, uint32_t **retptr,
  parsed_recurse_check *recurses, compile_block *cb, int *lcptr)
{
int errorcode = 0;
int nestlevel = 0;

cb->erroroffset = PCRE2_UNSET;

for (; *pptr != META_END; pptr++)
  {
  if (*pptr < META_END) continue;  /* Literal */

  switch (META_CODE(*pptr))
    {
    default:
    return ERR70;  /* Unrecognized meta code */

    case META_ESCAPE:
    if (*pptr - META_ESCAPE == ESC_P || *pptr - META_ESCAPE == ESC_p)
      pptr += 1;
    break;

    case META_KET:
    if (--nestlevel < 0)
      {
      if (retptr != NULL) *retptr = pptr;
      return 0;
      }
    break;

    case META_ATOMIC:
    case META_CAPTURE:
    case META_COND_ASSERT:
    case META_LOOKAHEAD:
    case META_LOOKAHEADNOT:
    case META_LOOKAHEAD_NA:
    case META_NOCAPTURE:
    case META_SCRIPT_RUN:
    nestlevel++;
    break;

    case META_ACCEPT:
    case META_ALT:
    case META_ASTERISK:
    case META_ASTERISK_PLUS:
    case META_ASTERISK_QUERY:
    case META_BACKREF:
    case META_CIRCUMFLEX:
    case META_CLASS:
    case META_CLASS_EMPTY:
    case META_CLASS_EMPTY_NOT:
    case META_CLASS_END:
    case META_CLASS_NOT:
    case META_COMMIT:
    case META_DOLLAR:
    case META_DOT:
    case META_FAIL:
    case META_PLUS:
    case META_PLUS_PLUS:
    case META_PLUS_QUERY:
    case META_PRUNE:
    case META_QUERY:
    case META_QUERY_PLUS:
    case META_QUERY_QUERY:
    case META_RANGE_ESCAPED:
    case META_RANGE_LITERAL:
    case META_SKIP:
    case META_THEN:
    break;

    case META_RECURSE:
    pptr += SIZEOFFSET;
    break;

    case META_BACKREF_BYNAME:
    case META_RECURSE_BYNAME:
    pptr += 1 + SIZEOFFSET;
    break;

    case META_COND_DEFINE:
    pptr += SIZEOFFSET;
    nestlevel++;
    break;

    case META_COND_NAME:
    case META_COND_NUMBER:
    case META_COND_RNAME:
    case META_COND_RNUMBER:
    pptr += 1 + SIZEOFFSET;
    nestlevel++;
    break;

    case META_COND_VERSION:
    pptr += 3;
    nestlevel++;
    break;

    case META_CALLOUT_STRING:
    pptr += 3 + SIZEOFFSET;
    break;

    case META_BIGVALUE:
    case META_POSIX:
    case META_POSIX_NEG:
    pptr += 1;
    break;

    case META_MINMAX:
    case META_MINMAX_QUERY:
    case META_MINMAX_PLUS:
    case META_OPTIONS:
    pptr += 2;
    break;

    case META_CALLOUT_NUMBER:
    pptr += 3;
    break;

    case META_MARK:
    case META_COMMIT_ARG:
    case META_PRUNE_ARG:
    case META_SKIP_ARG:
    case META_THEN_ARG:
    pptr += 1 + pptr[1];
    break;

    case META_LOOKBEHIND:
    case META_LOOKBEHINDNOT:
    case META_LOOKBEHIND_NA:
    if (!set_lookbehind_lengths(&pptr, &errorcode, lcptr, recurses, cb))
      return errorcode;
    break;
    }
  }

return 0;
}